

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall el::base::Writer::processDispatch(Writer *this)

{
  Logger *pLVar1;
  ulong uVar2;
  reference loggerId;
  bool bVar3;
  ulong __n;
  bool bVar4;
  allocator local_79;
  string_t logMessage;
  string local_50 [32];
  
  if ((*(byte *)(elStorage + 0x20) & 0x80) == 0) {
    if (this->m_proceed == true) {
      triggerDispatch(this);
      return;
    }
    pLVar1 = this->m_logger;
    if (pLVar1 != (Logger *)0x0) {
      std::__cxx11::string::string((string *)&logMessage,"",(allocator *)local_50);
      std::__cxx11::stringbuf::str((string *)&pLVar1->field_0x58);
      std::__cxx11::string::~string((string *)&logMessage);
      (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
    }
  }
  else {
    logMessage._M_dataplus._M_p = (pointer)&logMessage.field_2;
    logMessage._M_string_length = 0;
    logMessage.field_2._M_local_buf[0] = '\0';
    bVar3 = false;
    __n = 1;
    do {
      if (this->m_proceed == true) {
        if (bVar3) {
          std::operator<<((ostream *)&this->m_logger->field_0x50,(string *)&logMessage);
        }
        else if (0x20 < (ulong)((long)(this->m_loggerIds).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_loggerIds).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)) {
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&logMessage,local_50);
          std::__cxx11::string::~string(local_50);
        }
        bVar3 = true;
        triggerDispatch(this);
      }
      else {
        pLVar1 = this->m_logger;
        if (pLVar1 != (Logger *)0x0) {
          std::__cxx11::string::string(local_50,"",&local_79);
          std::__cxx11::stringbuf::str((string *)&pLVar1->field_0x58);
          std::__cxx11::string::~string(local_50);
          (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
        }
      }
      uVar2 = (long)(this->m_loggerIds).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_loggerIds).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (__n < uVar2) {
        loggerId = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&this->m_loggerIds,__n);
        initializeLogger(this,loggerId,true,true);
        uVar2 = (long)(this->m_loggerIds).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_loggerIds).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      bVar4 = __n < uVar2;
      __n = __n + 1;
    } while (bVar4);
    std::__cxx11::string::~string((string *)&logMessage);
  }
  return;
}

Assistant:

void processDispatch() {
#if ELPP_LOGGING_ENABLED
    if (ELPP->hasFlag(LoggingFlag::MultiLoggerSupport)) {
      bool firstDispatched = false;
      base::type::string_t logMessage;
      std::size_t i = 0;
      do {
        if (m_proceed) {
          if (firstDispatched) {
            m_logger->stream() << logMessage;
          } else {
            firstDispatched = true;
            if (m_loggerIds.size() > 1) {
              logMessage = m_logger->stream().str();
            }
          }
          triggerDispatch();
        } else if (m_logger != nullptr) {
          m_logger->stream().str(ELPP_LITERAL(""));
          m_logger->releaseLock();
        }
        if (i + 1 < m_loggerIds.size()) {
          initializeLogger(m_loggerIds.at(i + 1));
        }
      } while (++i < m_loggerIds.size());
    } else {
      if (m_proceed) {
        triggerDispatch();
      } else if (m_logger != nullptr) {
        m_logger->stream().str(ELPP_LITERAL(""));
        m_logger->releaseLock();
      }
    }
#else
    if (m_logger != nullptr) {
      m_logger->stream().str(ELPP_LITERAL(""));
      m_logger->releaseLock();
    }
#endif // ELPP_LOGGING_ENABLED
  }